

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

char * debugstr(int type,int value)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  
  switch(type) {
  case 0:
    bVar3 = value == 0;
    pcVar2 = "Message is a query";
    pcVar1 = "Message is a response";
    break;
  case 1:
    pcVar1 = "Unknow";
    if (value == 1) {
      pcVar1 = "Reverse query (1)";
    }
    pcVar2 = "Standard query (0)";
    if (value != 0) {
      pcVar2 = pcVar1;
    }
    return pcVar2;
  case 2:
    bVar3 = value == 0;
    pcVar2 = "Server is not an authority for domain";
    pcVar1 = "Server is an authority for domain";
    break;
  case 3:
    bVar3 = value == 0;
    pcVar2 = "Message is not truncated";
    pcVar1 = "Message is truncated";
    break;
  case 4:
  case 5:
    bVar3 = value == 0;
    pcVar2 = "Can\'t do recursively";
    pcVar1 = "Do query recursively";
    break;
  case 6:
    return "reserved (0)";
  case 7:
    bVar3 = value == 0;
    pcVar2 = "Answer/authority portion was not authenticated by the server";
    pcVar1 = "Answer/authority portion was authenticated by the server";
    break;
  case 8:
    bVar3 = value == 0;
    pcVar2 = "Non-authenticated data";
    pcVar1 = "Authenticated data";
    break;
  case 9:
    if ((uint)value < 6) {
      return &DAT_001061d8 + *(int *)(&DAT_001061d8 + (ulong)(uint)value * 4);
    }
    return "Unknow Eansweror";
  default:
    return "unknow";
  case 0xe:
    if (value == 0x1c) {
      return "AAAA";
    }
    if (value == 5) {
      return "CNAME";
    }
    if (value == 0xf) {
      return "MX";
    }
    if (value == 1) {
      return "A";
    }
    return "Unknow";
  case 0xf:
    bVar3 = value == 1;
    pcVar2 = "IN";
    pcVar1 = "Unknow";
  }
  if (bVar3) {
    pcVar1 = pcVar2;
  }
  return pcVar1;
}

Assistant:

inline static const char *debugstr(int type, int value) {
  switch (type) {
  case DEBUG_PRINT_TYPE_qr:
    /* code */
    if (value == 0)
      return "Message is a query";
    else
      return "Message is a response";
  case DEBUG_PRINT_TYPE_opcode:
    if (value == 0)
      return "Standard query (0)";
    else if (value == 1)
      return "Reverse query (1)";
    else
      return "Unknow";
  case DEBUG_PRINT_TYPE_aa:
    if (value == 0)
      return "Server is not an authority for domain";
    else
      return "Server is an authority for domain";
  case DEBUG_PRINT_TYPE_tc:
    if (value == 0)
      return "Message is not truncated";
    else
      return "Message is truncated";
  case DEBUG_PRINT_TYPE_rd:
    if (value == 0)
      return "Can't do recursively";
    else
      return "Do query recursively";
  case DEBUG_PRINT_TYPE_ra:
    if (value == 0)
      return "Can't do recursively";
    else
      return "Do query recursively";
  case DEBUG_PRINT_TYPE_z:
    return "reserved (0)";
  case DEBUG_PRINT_TYPE_ad:
    if (value == 0)
      return "Answer/authority portion was not authenticated by the server";
    else
      return "Answer/authority portion was authenticated by the server";
  case DEBUG_PRINT_TYPE_cd:
    if (value == 0)
      return "Non-authenticated data";
    else
      return "Authenticated data";
  case DEBUG_PRINT_TYPE_rcode:
    switch (value) {
    case 0:
      return "No eansweror (0)";
    case 1:
      return "FormEanswer (1)"; //格式错误
    case 2:
      return "ServFail (2)"; //服务器失效
    case 3:
      return "NXDomain (3)"; //不存在域名
    case 4:
      return "NotImp (4)"; //未实现
    case 5:
      return "Refused (5)"; //查询拒绝
    default:
      return "Unknow Eansweror";
    }
  case DEBUG_PRINT_TYPE_type:
    switch (value) {
    case RRTYPE_AAAA:
      return "AAAA";
    case RRTYPE_A:
      return "A";
    case RRTYPE_CNAME:
      return "CNAME";
    case RRTYPE_MX:
      return "MX";
    default:
      return "Unknow";
    }
  case DEBUG_PRINT_TYPE_class:
    if (value == HTTP_CLASS)
      return "IN";
    else
      return "Unknow";
  default:
    return "unknow";
  }
}